

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>
           *this)

{
  CDEFFindDirTest *this_00;
  
  WithParamInterface<std::tuple<int(*)(unsigned_short_const*,int,int*,int),int(*)(unsigned_short_const*,int,int*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (CDEFFindDirTest *)operator_new(0x28);
  anon_unknown.dwarf_2686dc::CDEFFindDirTest::CDEFFindDirTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ee65b8;
  (this_00->
  super_TestWithParam<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
  ).
  super_WithParamInterface<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__CDEFFindDirTest_TestSIMDNoMismatch_Test_00ee65f8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }